

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int little2_sameName(ENCODING *enc,char *ptr1,char *ptr2)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  
  do {
    bVar1 = ((byte *)ptr1)[1];
    uVar3 = (uint)bVar1;
    if (bVar1 < 0xdc) {
      if (bVar1 - 0xd8 < 4) {
LAB_00557cd9:
        if (*ptr1 != *ptr2) {
          return 0;
        }
        ptr1 = (char *)((byte *)ptr1 + 1);
        ptr2 = (char *)((byte *)ptr2 + 1);
LAB_00557ce9:
        if (*ptr1 != *ptr2) {
          return 0;
        }
        ptr1 = (char *)((byte *)ptr1 + 1);
        ptr2 = (char *)((byte *)ptr2 + 1);
      }
      else {
        if (uVar3 != 0) goto LAB_00557d4d;
        bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr1);
        if (bVar2 < 0x1e) {
          if ((0x2f400000U >> (bVar2 & 0x1f) & 1) != 0) goto LAB_00557d4d;
          if (bVar2 == 6) goto LAB_00557ce9;
          if (bVar2 == 7) goto LAB_00557cd9;
        }
        if (bVar2 != 5) {
LAB_00557d6d:
          bVar1 = ((byte *)ptr2)[1];
          if (bVar1 - 0xdc < 4) {
            return 1;
          }
          if (bVar1 == 0) {
            uVar3 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr2);
            if (0x1d < uVar3) {
              return 1;
            }
            if ((0x2f4000e0U >> (uVar3 & 0x1f) & 1) == 0) {
              return 1;
            }
          }
          else if ((bVar1 == 0xff) && (0xfd < (byte)*ptr2)) {
            return 1;
          }
          return 0;
        }
      }
      if (*ptr1 != *ptr2) {
        return 0;
      }
      if (((byte *)ptr1)[1] != ((byte *)ptr2)[1]) {
        return 0;
      }
    }
    else {
      if (uVar3 == 0xff) {
        if (0xfd < (byte)*ptr1) goto LAB_00557d6d;
      }
      else if (uVar3 - 0xdc < 4) goto LAB_00557d6d;
LAB_00557d4d:
      if (*ptr2 != *ptr1) {
        return 0;
      }
      if (((byte *)ptr2)[1] != bVar1) {
        return 0;
      }
    }
    ptr2 = (char *)((byte *)ptr2 + 2);
    ptr1 = (char *)((byte *)ptr1 + 2);
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(sameName)(const ENCODING *enc, const char *ptr1, const char *ptr2)
{
  for (;;) {
    switch (BYTE_TYPE(enc, ptr1)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (*ptr1++ != *ptr2++) \
        return 0;
    LEAD_CASE(4) LEAD_CASE(3) LEAD_CASE(2)
#undef LEAD_CASE
      /* fall through */
      if (*ptr1++ != *ptr2++)
        return 0;
      break;
    case BT_NONASCII:
    case BT_NMSTRT:
#ifdef XML_NS
    case BT_COLON:
#endif
    case BT_HEX:
    case BT_DIGIT:
    case BT_NAME:
    case BT_MINUS:
      if (*ptr2++ != *ptr1++)
        return 0;
      if (MINBPC(enc) > 1) {
        if (*ptr2++ != *ptr1++)
          return 0;
        if (MINBPC(enc) > 2) {
          if (*ptr2++ != *ptr1++)
            return 0;
          if (MINBPC(enc) > 3) {
            if (*ptr2++ != *ptr1++)
              return 0;
          }
        }
      }
      break;
    default:
      if (MINBPC(enc) == 1 && *ptr1 == *ptr2)
        return 1;
      switch (BYTE_TYPE(enc, ptr2)) {
      case BT_LEAD2:
      case BT_LEAD3:
      case BT_LEAD4:
      case BT_NONASCII:
      case BT_NMSTRT:
#ifdef XML_NS
      case BT_COLON:
#endif
      case BT_HEX:
      case BT_DIGIT:
      case BT_NAME:
      case BT_MINUS:
        return 0;
      default:
        return 1;
      }
    }
  }
  /* not reached */
}